

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::write_exponent<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (int exp,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> it)

{
  uint value;
  char8_t local_26;
  char8_t local_25;
  char8_t local_24;
  char8_t local_23;
  char8_t local_22;
  char8_t local_21;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      buffer<char8_t>::push_back(it.container,&local_21);
      exp = -exp;
    }
    else {
      buffer<char8_t>::push_back(it.container,&local_22);
    }
    value = exp;
    if (99 < (uint)exp) {
      value = (exp & 0xffffU) % 100;
      to_unsigned<int>((exp & 0xffffU) / 100);
      if (999 < (uint)exp) {
        buffer<char8_t>::push_back(it.container,&local_23);
      }
      buffer<char8_t>::push_back(it.container,&local_24);
    }
    to_unsigned<int>(value);
    buffer<char8_t>::push_back(it.container,&local_25);
    buffer<char8_t>::push_back(it.container,&local_26);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)it.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x508,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}